

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::
     log<char_const(&)[41],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,unsigned_char(&)[6]>&,kj::ArrayPtr<unsigned_char_const>,unsigned_char(&)[6]>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [41],
               DebugComparison<kj::ArrayPtr<const_unsigned_char>,_unsigned_char_(&)[6]> *params_1,
               ArrayPtr<const_unsigned_char> *params_2,uchar (*params_3) [6])

{
  undefined4 in_register_00000014;
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_unsigned_char_(&)[6]> *params_00;
  ArrayPtr<const_unsigned_char> *params_01;
  uchar (*params_02) [6];
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_fffffffffffffed8;
  ArrayDisposer **local_f0;
  undefined1 local_98 [8];
  String argValues [4];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_unsigned_char_(&)[6]> *params_local_1;
  char (*params_local) [41];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  str<char_const(&)[41]>
            ((String *)local_98,(kj *)params,(char (*) [41])CONCAT44(in_register_00000014,severity))
  ;
  str<kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,unsigned_char(&)[6]>&>
            ((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<kj::ArrayPtr<unsigned_char_const>&>
            ((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<unsigned_char(&)[6]>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  AVar1 = arrayPtr<kj::String>((String *)local_98,4);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_fffffffffffffed8);
  local_f0 = &argValues[3].content.disposer;
  do {
    local_f0 = local_f0 + -3;
    String::~String((String *)local_f0);
  } while (local_f0 != (ArrayDisposer **)local_98);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}